

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_util.cpp
# Opt level: O3

string * cali::util::clamp_string(string *__return_storage_ptr__,string *str,size_t max_width)

{
  ulong uVar1;
  pointer pcVar2;
  
  uVar1 = str->_M_string_length;
  if (max_width < uVar1) {
    if (max_width < 4) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)str,0);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append
                ((string *)__return_storage_ptr__,(ulong)str,
                 str->_M_string_length - ((max_width >> 1) - 1));
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cali::util::clamp_string(const std::string& str, std::size_t max_width)
{
    if (str.length() <= max_width)
        return str;
    if (max_width < 4)
        return str.substr(0, max_width);

    std::string ret;
    ret.reserve(1 + max_width);

    ret.append(str, 0, max_width / 2 - 1);
    ret.append("~~");
    ret.append(str, str.length() - (max_width / 2 - 1), std::string::npos);

    return ret;
}